

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

transaction_base * __thiscall pstore::transaction_base::rollback(transaction_base *this)

{
  bool bVar1;
  address aVar2;
  uint64_t uVar3;
  transaction_base *this_local;
  
  bVar1 = is_open(this);
  if (bVar1) {
    aVar2 = address::null();
    (this->first_).a_ = aVar2.a_;
    bVar1 = is_open(this);
    if (bVar1) {
      assert_failed("!this->is_open ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/transaction.cpp"
                    ,0x96);
    }
    uVar3 = database::size(this->db_);
    if (this->dbsize_ < uVar3) {
      (*this->db_->_vptr_database[5])(this->db_,this->dbsize_);
      uVar3 = database::size(this->db_);
      if (uVar3 != this->dbsize_) {
        assert_failed("db_.size () == dbsize_",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/transaction.cpp"
                      ,0x9a);
      }
    }
  }
  return this;
}

Assistant:

transaction_base & transaction_base::rollback () noexcept {
        if (this->is_open ()) {
            first_ = address::null ();
            PSTORE_ASSERT (!this->is_open ()); //! OCLINT(PH - don't warn about the assert macro)
            // if we grew the db, truncate it back
            if (db_.size () > dbsize_) {
                db_.truncate (dbsize_);
                PSTORE_ASSERT (db_.size () == dbsize_);
            }
        }
        return *this;
    }